

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O2

BOOL installMethodInDtable
               (Class class,SparseArray *dtable,objc_method *method,objc_method *method_to_replace,
               BOOL replaceExisting)

{
  objc_class *cls;
  BOOL BVar1;
  uint32_t uVar2;
  int iVar3;
  objc_method *method_to_replace_00;
  dtable_t dtable_00;
  Class *ppoVar4;
  long lStack_40;
  
  uVar2 = *(uint32_t *)&method->selector->field_0;
  method_to_replace_00 = (objc_method *)SparseArrayLookup(dtable,uVar2);
  if ((method_to_replace_00 != method_to_replace) ||
     ((method_to_replace != (objc_method *)0x0 && (method_to_replace_00->imp == method->imp)))) {
    return '\0';
  }
  SparseArrayInsert(dtable,uVar2,method);
  uVar2 = get_untyped_idx(method->selector);
  SparseArrayInsert(dtable,uVar2,method);
  if (installMethodInDtable::cxx_construct == (SEL)0x0) {
    installMethodInDtable::cxx_construct = sel_registerName(".cxx_construct");
    installMethodInDtable::cxx_destruct = sel_registerName(".cxx_destruct");
  }
  BVar1 = selEqualUnTyped(method->selector,installMethodInDtable::cxx_construct);
  if (BVar1 == '\0') {
    BVar1 = selEqualUnTyped(method->selector,installMethodInDtable::cxx_destruct);
    if (BVar1 == '\0') goto LAB_00111532;
    lStack_40 = 0x58;
  }
  else {
    lStack_40 = 0x50;
  }
  *(IMP *)((long)&class->isa + lStack_40) = method->imp;
LAB_00111532:
  ppoVar4 = &class->subclass_list;
  while (cls = *ppoVar4, cls != (objc_class *)0x0) {
    iVar3 = classHasDtable(cls);
    if (iVar3 != 0) {
      dtable_00 = dtable_for_class(cls);
      installMethodInDtable(cls,dtable_00,method,method_to_replace_00,replaceExisting);
    }
    ppoVar4 = &cls->sibling_class;
  }
  if (method_to_replace != (objc_method *)0x0) {
    LOCK();
    objc_method_cache_version = objc_method_cache_version + 1;
    UNLOCK();
  }
  return '\x01';
}

Assistant:

static BOOL installMethodInDtable(Class class,
                                  SparseArray *dtable,
                                  struct objc_method *method,
                                  struct objc_method *method_to_replace,
                                  BOOL replaceExisting)
{
	ASSERT(uninstalled_dtable != dtable);
	uint32_t sel_id = method->selector->index;
	struct objc_method *oldMethod = SparseArrayLookup(dtable, sel_id);
	// If we're being asked to replace an existing method, don't if it's the
	// wrong one.
	if ((replaceExisting) && (method_to_replace != oldMethod))
	{
		return NO;
	}
	// If we're not being asked to replace existing methods and there is an
	// existing one, don't replace it.
	if (!replaceExisting && (oldMethod != NULL))
	{
		return NO;
	}
	// If this method is the one already installed, pretend to install it again.
	if (NULL != oldMethod && (oldMethod->imp == method->imp))
	{
		return NO;
	}
	SparseArrayInsert(dtable, sel_id, method);
	// In TDD mode, we also register the first typed method that we
	// encounter as the untyped version.
#ifdef TYPE_DEPENDENT_DISPATCH
	uint32_t untyped_idx = get_untyped_idx(method->selector);
	SparseArrayInsert(dtable, untyped_idx, method);
#endif

	static SEL cxx_construct, cxx_destruct;
	if (NULL == cxx_construct)
	{
		cxx_construct = sel_registerName(".cxx_construct");
		cxx_destruct = sel_registerName(".cxx_destruct");
	}
	if (selEqualUnTyped(method->selector, cxx_construct))
	{
		class->cxx_construct = method->imp;
	}
	else if (selEqualUnTyped(method->selector, cxx_destruct))
	{
		class->cxx_destruct = method->imp;
	}

	for (struct objc_class *subclass=class->subclass_list ; 
		Nil != subclass ; subclass = subclass->sibling_class)
	{
		// Don't bother updating dtables for subclasses that haven't been
		// initialized yet
		if (!classHasDtable(subclass)) { continue; }

		// Recursively install this method in all subclasses
		installMethodInDtable(subclass,
		                      dtable_for_class(subclass),
		                      method,
		                      oldMethod,
		                      YES);
	}

	// Invalidate the old slot, if there is one.
	if (NULL != oldMethod)
	{
#ifndef NO_SAFE_CACHING
		objc_method_cache_version++;
#endif
	}
	return YES;
}